

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O1

dlist_t * dlist_search(dlist_head_t *head,void *data,_func_int_void_ptr_void_ptr *cmp)

{
  dlist_t *pdVar1;
  int iVar2;
  
  if (head != (dlist_head_t *)0x0) {
    for (pdVar1 = head->dlist; pdVar1 != (dlist_t *)0x0; pdVar1 = pdVar1->next) {
      iVar2 = (*cmp)(data,pdVar1->data);
      if (iVar2 != 0) {
        return pdVar1;
      }
    }
  }
  return (dlist_t *)0x0;
}

Assistant:

dlist_t *dlist_search(dlist_head_t *head,
      void *data,
      int (*cmp)(void *data, void *data2)) {
   dlist_t *dlist;

   if (!head || !head->dlist)
      return NULL;

   dlist = head->dlist;

   while (dlist) {
      if (cmp(data, dlist->data))
         return dlist;
      dlist = dlist->next;
   }

   return NULL;
}